

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O0

Builder * __thiscall
capnproto_test::capnp::test::TestInterleavedGroups::Group1::Builder::initCorge
          (Builder *__return_storage_ptr__,Builder *this)

{
  StructBuilder base;
  uint uVar1;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  PointerBuilder local_40;
  PointerBuilder local_28;
  Builder *local_10;
  Builder *this_local;
  
  local_10 = this;
  uVar1 = ::capnp::bounded<14u>();
  ::capnp::_::StructBuilder::
  setDataField<capnproto_test::capnp::test::TestInterleavedGroups::Group1::Which>
            (&this->_builder,uVar1,CORGE);
  uVar1 = ::capnp::bounded<12u>();
  ::capnp::_::StructBuilder::setDataField<unsigned_short>(&this->_builder,uVar1,0);
  uVar1 = ::capnp::bounded<4u>();
  ::capnp::_::StructBuilder::setDataField<unsigned_long>(&this->_builder,uVar1,0);
  uVar1 = ::capnp::bounded<2u>();
  ::capnp::_::StructBuilder::getPointerField(&local_28,&this->_builder,uVar1);
  ::capnp::_::PointerBuilder::clear(&local_28);
  uVar1 = ::capnp::bounded<4u>();
  ::capnp::_::StructBuilder::getPointerField(&local_40,&this->_builder,uVar1);
  ::capnp::_::PointerBuilder::clear(&local_40);
  memcpy(&local_68,this,0x28);
  base.capTable = (CapTableBuilder *)uStack_60;
  base.segment = (SegmentBuilder *)local_68;
  base.data = (void *)local_58;
  base.pointers = (WirePointer *)uStack_50;
  base.dataSize = (undefined4)local_48;
  base.pointerCount = local_48._4_2_;
  base._38_2_ = local_48._6_2_;
  Corge::Builder::Builder(__return_storage_ptr__,base);
  return __return_storage_ptr__;
}

Assistant:

inline typename TestInterleavedGroups::Group1::Corge::Builder TestInterleavedGroups::Group1::Builder::initCorge() {
  _builder.setDataField<TestInterleavedGroups::Group1::Which>(
      ::capnp::bounded<14>() * ::capnp::ELEMENTS, TestInterleavedGroups::Group1::CORGE);
  _builder.setDataField< ::uint16_t>(::capnp::bounded<12>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField< ::uint64_t>(::capnp::bounded<4>() * ::capnp::ELEMENTS, 0);
  _builder.getPointerField(::capnp::bounded<2>() * ::capnp::POINTERS).clear();
  _builder.getPointerField(::capnp::bounded<4>() * ::capnp::POINTERS).clear();
  return typename TestInterleavedGroups::Group1::Corge::Builder(_builder);
}